

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O3

int sort_rooms_standard_comp(void *va,void *vb)

{
  int iVar1;
  
  iVar1 = *(int *)((long)va + 4) - *(int *)((long)vb + 4);
  if (iVar1 == 0) {
    iVar1 = *(int *)((long)va + 8) - *(int *)((long)vb + 8);
  }
  return iVar1;
}

Assistant:

static int sort_rooms_standard_comp(const void *va, const void *vb)
{
	const struct sort_rooms_data *a, *b;
	a = (const struct sort_rooms_data *)va;
	b = (const struct sort_rooms_data *)vb;
	if (a->lx != b->lx)
		return a->lx - b->lx;
	return a->ly - b->ly;
}